

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::promoteScalar(Builder *this,Decoration precision,Id *left,Id *right)

{
  uint scalar;
  int iVar1;
  int iVar2;
  Id IVar3;
  Id *pIVar4;
  
  iVar1 = getNumComponents(this,*right);
  iVar2 = getNumComponents(this,*left);
  pIVar4 = left;
  if ((iVar2 < iVar1) || (pIVar4 = right, right = left, iVar1 - iVar2 < 0)) {
    scalar = *pIVar4;
    IVar3 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[scalar]->typeId;
    iVar1 = getNumComponents(this,*right);
    IVar3 = makeVectorType(this,IVar3,iVar1);
    IVar3 = smearScalar(this,precision,scalar,IVar3);
    *pIVar4 = IVar3;
  }
  return;
}

Assistant:

void Builder::promoteScalar(Decoration precision, Id& left, Id& right)
{
    int direction = getNumComponents(right) - getNumComponents(left);

    if (direction > 0)
        left = smearScalar(precision, left, makeVectorType(getTypeId(left), getNumComponents(right)));
    else if (direction < 0)
        right = smearScalar(precision, right, makeVectorType(getTypeId(right), getNumComponents(left)));

    return;
}